

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O0

void __thiscall astar::details::LogStream::~LogStream(LogStream *this)

{
  ostream *this_00;
  LogStream *this_local;
  
  this_00 = std::operator<<((ostream *)&std::cerr,(string *)this);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~LogStream() { std::cerr << data << std::endl; }